

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

char * icu_63::PropNameData::getPropertyValueName(int32_t property,int32_t value,int32_t nameChoice)

{
  int32_t iVar1;
  int32_t nameGroupOffset;
  int32_t valueMapIndex;
  int32_t nameChoice_local;
  int32_t value_local;
  int32_t property_local;
  
  iVar1 = findProperty(property);
  if (iVar1 == 0) {
    _value_local = (char *)0x0;
  }
  else {
    iVar1 = findPropertyValueNameGroup((&valueMaps)[iVar1 + 1],value);
    if (iVar1 == 0) {
      _value_local = (char *)0x0;
    }
    else {
      _value_local = getName(&nameGroups + iVar1,nameChoice);
    }
  }
  return _value_local;
}

Assistant:

const char *PropNameData::getPropertyValueName(int32_t property, int32_t value, int32_t nameChoice) {
    int32_t valueMapIndex=findProperty(property);
    if(valueMapIndex==0) {
        return NULL;  // Not a known property.
    }
    int32_t nameGroupOffset=findPropertyValueNameGroup(valueMaps[valueMapIndex+1], value);
    if(nameGroupOffset==0) {
        return NULL;
    }
    return getName(nameGroups+nameGroupOffset, nameChoice);
}